

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void x86_64_pbsload(dill_stream s,int type,int junk,int dest,int src1,int src2)

{
  int rex;
  uint rex_00;
  
  if (type == 9) {
    x86_64_pload(s,4,junk,0,src1,src2);
    BYTE_OUT2R(s,0,0xf,200);
    rex = (uint)(7 < dest) << 2;
  }
  else {
    if (type != 10) {
      x86_64_pload(s,type,junk,dest,src1,src2);
      if (8 < (uint)type) {
        return;
      }
      rex_00 = (uint)(7 < dest);
      if ((0x1c0U >> (type & 0x1fU) & 1) == 0) {
        if ((0xcU >> (type & 0x1fU) & 1) != 0) {
          BYTE_OUT2R(s,rex_00,0xf,dest & 7U | 200);
          x86_64_rshi(s,dest,dest,0x10);
          return;
        }
        if ((0x30U >> (type & 0x1fU) & 1) == 0) {
          return;
        }
      }
      else {
        rex_00 = rex_00 | 8;
      }
      BYTE_OUT2R(s,rex_00,0xf,dest & 7U | 200);
      return;
    }
    x86_64_pload(s,6,junk,0,src1,src2);
    rex = (uint)(7 < dest) * 4 + 8;
    BYTE_OUT2R(s,8,0xf,200);
  }
  BYTE_OUT1R3(s,0x66,rex,0x6e,(dest & 0x1fU | 0x18) << 3,src2);
  return;
}

Assistant:

extern void
x86_64_pbsload(dill_stream s, int type, int junk, int dest, int src1, int src2)
{
    int rex = 0;
    int fdest = dest;
    int ltype = type;
    switch (type) {
    case DILL_D:
        ltype = DILL_L;
        fdest = dest;
        dest = EAX;
        break;
    case DILL_F:
        ltype = DILL_I;
        fdest = dest;
        dest = EAX;
        break;
    }
    if (dest > RDI)
        rex |= REX_B;
    x86_64_pload(s, ltype, junk, dest, src1, src2);
    switch (type) {
    case DILL_F:
        rex = 0;
        x86_64_bswap(s, 0, DILL_I, EAX, EAX);
        if (fdest > RDI)
            rex |= REX_R;
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_D:
        rex = REX_W;
        if (fdest > RDI)
            rex |= REX_R;
        x86_64_bswap(s, 0, DILL_L, EAX, EAX);
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
        rex |= REX_W;
    case DILL_I:
    case DILL_U:
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        break;
    case DILL_S:
    case DILL_US:
        /* byteswap 32 bits and shift down 16 */
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        x86_64_rshi(s, dest, dest, 16);
        break;
    case DILL_C:
    case DILL_UC:
        break;
    }
}